

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_profile(sqlite3 *db,_func_void_void_ptr_char_ptr_sqlite_uint64 *xProfile,void *pArg)

{
  void *pvVar1;
  void *pOld;
  void *pArg_local;
  _func_void_void_ptr_char_ptr_sqlite_uint64 *xProfile_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  pvVar1 = db->pProfileArg;
  db->xProfile = (_func_void_void_ptr_char_ptr_u64 *)xProfile;
  db->pProfileArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_profile(
  sqlite3 *db,
  void (*xProfile)(void*,const char*,sqlite_uint64),
  void *pArg
){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pProfileArg;
  db->xProfile = xProfile;
  db->pProfileArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}